

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serve_static_content.hpp
# Opt level: O2

error_or<int> * __thiscall
pstore::http::details::
read_and_send<(anonymous_namespace)::ServeStaticContent::serve_path(std::__cxx11::string_const&)const::__0,int>
          (error_or<int> *__return_storage_ptr__,details *this,anon_class_8_1_4c539acc sender,int io
          ,descriptor *fd)

{
  ssize_t sVar1;
  undefined4 in_register_0000000c;
  int io_local;
  __shared_ptr<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2> local_470;
  error_or<int> eo;
  not_null<void_*> local_448;
  span<const_unsigned_char,__1L> local_440;
  array<unsigned_char,_1024UL> buffer;
  
  io_local = (int)sender.actual;
  memset(&buffer,0,0x400);
  local_448.ptr_ = &buffer;
  pstore::gsl::not_null<void_*>::ensure_invariant(&local_448);
  sVar1 = romfs::descriptor::read
                    ((descriptor *)CONCAT44(in_register_0000000c,io),(int)local_448.ptr_,(void *)0x1
                     ,0x400);
  if (sVar1 == 0) {
    error_or<int>::error_or<int&,void>(__return_storage_ptr__,&io_local);
  }
  else {
    pstore::gsl::span<const_unsigned_char,_-1L>::span
              (&local_440,buffer._M_elems,buffer._M_elems + sVar1);
    send<(anonymous_namespace)::ServeStaticContent::serve_path(std::__cxx11::string_const&)const::__0,int>
              (&eo,(http *)this,sender.actual & 0xffffffff,(int)&local_440,
               (span<const_unsigned_char,__1L> *)fd);
    if (eo.has_error_ == true) {
      error_or<int>::error_or(__return_storage_ptr__,&eo);
    }
    else {
      std::__shared_ptr<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_470,
                 (__shared_ptr<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(in_register_0000000c,io));
      read_and_send<(anonymous_namespace)::ServeStaticContent::serve_path(std::__cxx11::string_const&)const::__0,int>
                (__return_storage_ptr__,this,sender.actual & 0xffffffff,(int)&local_470,fd);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_470._M_refcount);
    }
    error_or<int>::~error_or(&eo);
  }
  return __return_storage_ptr__;
}

Assistant:

pstore::error_or<IO> read_and_send (Sender sender, IO io,
                                                pstore::romfs::descriptor fd) {
                std::array<std::uint8_t, 1024> buffer{{0}};
                auto * const data = buffer.data ();
                std::size_t const num_read =
                    fd.read (data, sizeof (decltype (buffer)::value_type), buffer.size ());
                if (num_read == 0) {
                    return pstore::error_or<IO>{io};
                }
                pstore::error_or<IO> const eo =
                    send (sender, io, gsl::span<std::uint8_t const> (data, data + num_read));
                if (!eo) {
                    return eo;
                }
                return read_and_send (sender, io, fd);
            }